

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

float __thiscall Json::Value::asFloat(Value *this)

{
  float fVar1;
  double dVar2;
  OStringStream oss;
  String local_1a0;
  ostringstream local_180 [376];
  
  switch(*(undefined1 *)&this->bits_) {
  case 1:
    fVar1 = (float)(this->value_).int_;
    break;
  case 2:
    dVar2 = (double)((this->value_).uint_ >> 1);
    fVar1 = (float)(dVar2 + dVar2 + (double)((uint)(this->value_).uint_ & 1));
    break;
  case 3:
    fVar1 = (float)(this->value_).real_;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_180,"Value is not convertible to float.",0x22);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
  case 5:
    if ((this->value_).bool_ != false) {
      return 1.0;
    }
  case 0:
    fVar1 = 0.0;
  }
  return fVar1;
}

Assistant:

ValueType Value::type() const {
  return static_cast<ValueType>(bits_.value_type_);
}